

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

ON_AngularDimension2Extra * ON_AngularDimension2Extra::Cast(ON_Object *p)

{
  bool bVar1;
  ON_AngularDimension2Extra *pOVar2;
  
  if (p != (ON_Object *)0x0) {
    bVar1 = ON_Object::IsKindOf(p,&m_ON_AngularDimension2Extra_class_rtti);
    pOVar2 = (ON_AngularDimension2Extra *)0x0;
    if (bVar1) {
      pOVar2 = (ON_AngularDimension2Extra *)p;
    }
    return pOVar2;
  }
  return (ON_AngularDimension2Extra *)0x0;
}

Assistant:

ON_AngularDimension2Extra* ON_AngularDimension2Extra::AngularDimensionExtra(ON_OBSOLETE_V5_DimAngular* pDim)
{
  ON_AngularDimension2Extra* pExtra = 0;
  if(pDim)
  {
    pExtra = ON_AngularDimension2Extra::Cast(pDim->GetUserData(ON_CLASS_ID(ON_AngularDimension2Extra)));
    if(pExtra == 0)
    {
      pExtra = new ON_AngularDimension2Extra;
      if( pExtra)
      {
        if(!pDim->AttachUserData(pExtra))
        {
          delete pExtra;
          pExtra = 0;
        }
      }
    }
  }
  return pExtra;
}